

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
FastVector<ExecutorX86::Breakpoint,_false,_false>::grow_and_add
          (FastVector<ExecutorX86::Breakpoint,_false,_false> *this,uint newSize,Breakpoint *val)

{
  uint uVar1;
  Breakpoint *pBVar2;
  Breakpoint *pBVar3;
  Breakpoint *pBVar4;
  bool bVar5;
  
  pBVar2 = this->data;
  grow_no_destroy(this,newSize);
  pBVar3 = this->data;
  uVar1 = this->count;
  this->count = uVar1 + 1;
  bVar5 = val->oneHit;
  pBVar4 = pBVar3 + uVar1;
  pBVar4->oldOpcode = val->oldOpcode;
  pBVar4->oneHit = bVar5;
  pBVar3[uVar1].instIndex = val->instIndex;
  if (pBVar2 != (Breakpoint *)0x0) {
    (*(code *)NULLC::dealloc)(pBVar2);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}